

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

Boxed_Value
chaiscript::dispatch::detail::Do_Call<chaiscript::Boxed_Value&>::
go<chaiscript::Boxed_Value&(chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&),chaiscript::dispatch::detail::Caller<chaiscript::Boxed_Value&,chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>>
          (Caller<chaiscript::Boxed_Value_&,_chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
           *fun,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params,
          Type_Conversions_State *t_conversions)

{
  Function_Signature<chaiscript::Boxed_Value_&(chaiscript::Boxed_Value_&,_const_chaiscript::Boxed_Value_&)>
  *in_RCX;
  element_type *in_RDI;
  Boxed_Value BVar1;
  element_type *peVar2;
  Caller<chaiscript::Boxed_Value_&,_chaiscript::Boxed_Value,_const_chaiscript::Boxed_Value_&>
  *in_stack_ffffffffffffffd8;
  
  peVar2 = in_RDI;
  call_func<chaiscript::dispatch::detail::Caller<chaiscript::Boxed_Value&,chaiscript::Boxed_Value,chaiscript::Boxed_Value_const&>,chaiscript::Boxed_Value&,chaiscript::Boxed_Value&,chaiscript::Boxed_Value_const&>
            (in_RCX,in_stack_ffffffffffffffd8,
             (vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)in_RDI,
             (Type_Conversions_State *)in_RDI);
  BVar1 = Handle_Return<chaiscript::Boxed_Value_&>::handle((Boxed_Value *)in_RDI);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar2;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Boxed_Value go(const Callable &fun, const std::vector<Boxed_Value> &params, const Type_Conversions_State &t_conversions)
          {
            return Handle_Return<Ret>::handle(call_func(Function_Signature<Signature>(), fun, params, t_conversions));
          }